

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O1

size_t benchmark::RunSpecifiedBenchmarks
                 (BenchmarkReporter *console_reporter,BenchmarkReporter *file_reporter)

{
  bool bVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  double dVar4;
  undefined1 auVar5 [16];
  mutex_type *pmVar6;
  pointer ptVar7;
  undefined8 uVar8;
  char *pcVar9;
  BenchmarkReporter *pBVar10;
  BenchmarkReporter *pBVar11;
  bool bVar12;
  char cVar13;
  int iVar14;
  ostream *poVar15;
  __uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
  *this;
  Instance *benchmark_1;
  pointer pIVar16;
  ulong uVar17;
  Instance *pIVar18;
  size_t sVar19;
  pointer iters;
  pointer __p;
  BenchmarkReporter *pBVar20;
  thread *thread;
  ulong uVar21;
  char *__s;
  pointer ptVar22;
  Instance *benchmark;
  unique_lock<std::mutex> *puVar23;
  bool bVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  __pthread_internal_list *p_Var28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar34;
  undefined1 auVar33 [16];
  vector<std::thread,_std::allocator<std::thread>_> pool;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  stat_reports;
  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  benchmarks;
  string label;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  complexity_reports;
  string spec;
  ThreadStats total;
  string mem;
  Notification done;
  Context context;
  ofstream output_file;
  int local_4f4;
  BenchmarkReporter *local_4f0;
  vector<std::thread,_std::allocator<std::thread>_> local_4e8;
  __pthread_internal_list *local_4c8;
  double dStack_4c0;
  int local_4b4;
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [24];
  size_type local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  bool local_470;
  _Alloc_hider local_468;
  char *local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  int64_t local_448;
  TimeUnit local_440;
  __pthread_internal_list *local_438;
  __pthread_internal_list *p_Stack_430;
  double dStack_428;
  undefined4 uStack_420;
  undefined4 local_41c;
  int iStack_418;
  undefined8 uStack_414;
  BigOFunc *local_408;
  int local_400;
  undefined2 local_3fc;
  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  local_3f8;
  thread local_3d8;
  undefined8 local_3d0;
  undefined1 local_3c8 [16];
  __pthread_internal_list *local_3b8;
  double dStack_3b0;
  BenchmarkReporter *local_3a8;
  BenchmarkReporter *local_3a0;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  local_398;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  local_378;
  string local_358;
  ThreadStats local_338;
  BenchmarkReporter *local_320;
  Instance *local_318;
  CheckHandler local_310;
  undefined1 local_308 [16];
  undefined8 local_2f8;
  undefined1 local_2f0 [16];
  CheckHandler local_2e0;
  CheckHandler local_2d8;
  CheckHandler local_2d0;
  __pthread_internal_list *local_2c8;
  undefined8 uStack_2c0;
  __native_type local_2b8;
  condition_variable local_290 [48];
  undefined1 local_260;
  int local_250 [2];
  double local_248;
  undefined1 local_240;
  ulong local_238;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_358,FLAGS_benchmark_filter_abi_cxx11_._M_dataplus._M_p,
             FLAGS_benchmark_filter_abi_cxx11_._M_dataplus._M_p +
             FLAGS_benchmark_filter_abi_cxx11_._M_string_length);
  if (((char *)local_358._M_string_length == (char *)0x0) ||
     (iVar14 = std::__cxx11::string::compare((char *)&local_358), iVar14 == 0)) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_358,0,(char *)local_358._M_string_length,0x1356c0);
  }
  local_3f8.
  super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  ._M_impl.super__Vector_impl_data._M_start = (Instance *)0x0;
  local_3f8.
  super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Instance *)0x0;
  local_3f8.
  super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  internal::BenchmarkFamilies::GetInstance();
  bVar12 = internal::BenchmarkFamilies::FindBenchmarks
                     (&internal::BenchmarkFamilies::GetInstance::instance,&local_358,&local_3f8);
  pIVar16 = local_3f8.
            super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (bVar12) {
    pIVar18 = local_3f8.
              super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (FLAGS_benchmark_list_tests == true) {
      for (; pIVar18 != pIVar16; pIVar18 = pIVar18 + 1) {
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(pIVar18->name)._M_dataplus._M_p,
                             (pIVar18->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
      }
    }
    else {
      std::ofstream::ofstream(&local_230);
      if (console_reporter == (BenchmarkReporter *)0x0) {
        internal::anon_unknown_7::CreateReporter
                  ((anon_unknown_7 *)local_4b0,&FLAGS_benchmark_format_abi_cxx11_,
                   (uint)FLAGS_color_print);
        local_4f0 = (BenchmarkReporter *)local_4b0._0_8_;
        console_reporter = (BenchmarkReporter *)local_4b0._0_8_;
      }
      else {
        local_4f0 = (BenchmarkReporter *)0x0;
      }
      iVar14 = std::__cxx11::string::compare((char *)&FLAGS_benchmark_out_abi_cxx11_);
      if ((file_reporter != (BenchmarkReporter *)0x0) && (iVar14 == 0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "A custom file reporter was provided but --benchmark_out=<file> was not specified."
                   ,0x51);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
LAB_0011e7e2:
        exit(1);
      }
      iVar14 = std::__cxx11::string::compare((char *)&FLAGS_benchmark_out_abi_cxx11_);
      pBVar20 = (BenchmarkReporter *)0x0;
      if (iVar14 != 0) {
        std::ofstream::open((string *)&local_230,0x143948);
        cVar13 = std::__basic_file<char>::is_open();
        if (cVar13 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"invalid file name: \'",0x14);
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,FLAGS_benchmark_out_abi_cxx11_._M_dataplus._M_p
                               ,FLAGS_benchmark_out_abi_cxx11_._M_string_length);
          std::endl<char,std::char_traits<char>>(poVar15);
          goto LAB_0011e7e2;
        }
        if (file_reporter == (BenchmarkReporter *)0x0) {
          internal::anon_unknown_7::CreateReporter
                    ((anon_unknown_7 *)local_4b0,&FLAGS_benchmark_out_format_abi_cxx11_,OO_None);
          file_reporter = (BenchmarkReporter *)local_4b0._0_8_;
          pBVar20 = (BenchmarkReporter *)local_4b0._0_8_;
        }
        else {
          pBVar20 = (BenchmarkReporter *)0x0;
        }
        file_reporter->output_stream_ = (ostream *)&local_230;
        file_reporter->error_stream_ = (ostream *)&local_230;
      }
      if (console_reporter == (BenchmarkReporter *)0x0) {
        internal::CheckHandler::CheckHandler
                  (&local_310,"console_reporter != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
                   ,"RunMatchingBenchmarks",0x400);
        internal::CheckHandler::~CheckHandler(&local_310);
      }
      internal::GetNullLogInstance();
      bVar12 = 1 < FLAGS_benchmark_repetitions;
      if (local_3f8.
          super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_3f8.
          super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar21 = 10;
      }
      else {
        pIVar16 = local_3f8.
                  super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar17 = 10;
        do {
          uVar21 = (pIVar16->name)._M_string_length;
          if (uVar21 < uVar17) {
            uVar21 = uVar17;
          }
          bVar12 = (bool)(bVar12 | 1 < pIVar16->repetitions);
          pIVar16 = pIVar16 + 1;
          uVar17 = uVar21;
        } while (pIVar16 !=
                 local_3f8.
                 super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      uVar17 = uVar21 + 7;
      if (!bVar12) {
        uVar17 = uVar21;
      }
      local_250[0] = NumCPUs();
      local_248 = CyclesPerSecond();
      local_248 = local_248 / 1000000.0;
      local_240 = CpuScalingEnabled();
      local_378.
      super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_378.
      super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_378.
      super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_3a8 = console_reporter;
      local_238 = uVar17;
      cVar13 = (*(code *)**(undefined8 **)
                           &((__mutex_base *)&console_reporter->_vptr_BenchmarkReporter)->_M_mutex)
                         (console_reporter);
      if ((cVar13 != '\0') &&
         (((file_reporter == (BenchmarkReporter *)0x0 ||
           (cVar13 = (*(code *)**(undefined8 **)
                                 &((__mutex_base *)&file_reporter->_vptr_BenchmarkReporter)->
                                  _M_mutex)(file_reporter,local_250), cVar13 != '\0')) &&
          (local_318 = local_3f8.
                       super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
          pIVar18 = local_3f8.
                    super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                    ._M_impl.super__Vector_impl_data._M_start, pBVar10 = pBVar20,
          pBVar11 = file_reporter,
          local_3f8.
          super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_3f8.
          super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
          ._M_impl.super__Vector_impl_data._M_finish)))) {
        do {
          local_320 = pBVar11;
          local_3a0 = pBVar10;
          local_398.
          super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_398.
          super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_398.
          super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_4e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_4e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_4e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          if (pIVar18->multithreaded == true) {
            std::vector<std::thread,_std::allocator<std::thread>_>::resize
                      (&local_4e8,(long)pIVar18->threads);
          }
          local_4b4 = pIVar18->repetitions;
          if (pIVar18->repetitions == 0) {
            local_4b4 = FLAGS_benchmark_repetitions;
          }
          if (local_4b4 == 1) {
            cVar13 = '\0';
          }
          else {
            cVar13 = FLAGS_benchmark_report_aggregates_only;
            if (pIVar18->report_mode != RM_Unspecified) {
              cVar13 = pIVar18->report_mode == RM_ReportAggregatesOnly;
            }
          }
          if (0 < local_4b4) {
            iters = (pointer)0x1;
            local_4f4 = 0;
            do {
              local_308._8_8_ = local_2f0;
              local_2f8 = 0;
              local_2f0[0] = 0;
              do {
                iVar14 = internal::GetLogLevel();
                if (iVar14 < 2) {
                  poVar15 = internal::GetNullLogInstance();
                }
                else {
                  poVar15 = internal::GetErrorLogInstance();
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,"-- LOG(",7);
                poVar15 = (ostream *)std::ostream::operator<<(poVar15,2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,"): ",3);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,"Running ",8);
                poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar15,(pIVar18->name)._M_dataplus._M_p,
                                     (pIVar18->name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15," for ",5);
                poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
                __p = (pointer)0x135eeb;
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
                if (GetBenchmarkLock()::lock == '\0') {
                  RunSpecifiedBenchmarks();
                }
                local_4b0._0_8_ = GetBenchmarkLock()::lock;
                local_4b0._8_8_ = local_4b0._8_8_ & 0xffffffffffffff00;
                std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_4b0);
                local_4b0[8] = 1;
                (anonymous_namespace)::GetReportLabel_abi_cxx11_();
                (anonymous_namespace)::GetReportLabel[abi:cxx11]()::label_abi_cxx11_.
                _M_string_length = 0;
                *(anonymous_namespace)::GetReportLabel[abi:cxx11]()::label_abi_cxx11_._M_dataplus.
                 _M_p = '\0';
                std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_4b0);
                LOCK();
                (anonymous_namespace)::error_message = (char *)0x0;
                UNLOCK();
                local_2b8.__data.__list.__next = (__pthread_internal_list *)0x0;
                local_2b8._16_8_ = 0;
                local_2b8.__data.__list.__prev = (__pthread_internal_list *)0x0;
                local_2b8.__align = 0;
                local_2b8._8_8_ = 0;
                std::condition_variable::condition_variable(local_290);
                local_260 = 0;
                this = (__uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                        *)operator_new(0xa8);
                iVar14 = pIVar18->threads;
                this[2]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                this[3]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                (this->_M_t).
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                this[1]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                this[4]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                std::condition_variable::condition_variable((condition_variable *)(this + 5));
                *(int *)&this[0xb]._M_t.
                         super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                         .
                         super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>
                         ._M_head_impl = iVar14;
                *(int *)((long)&this[0xb]._M_t.
                                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                                .
                                super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>
                                ._M_head_impl + 4) = iVar14;
                this[0xc]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)&local_2b8;
                *(undefined1 *)
                 &this[0xd]._M_t.
                  super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                  .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                  _M_head_impl = 0;
                this[0x10]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                this[0x11]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                this[0x12]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                this[0x13]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                *(undefined4 *)
                 &this[0x14]._M_t.
                  super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                  .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                  _M_head_impl = 0;
                std::
                __uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                ::reset(this,__p);
                ptVar7 = local_4e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                local_338.complexity_n = 0;
                local_338.bytes_processed = 0;
                local_338.items_processed = 0;
                (anonymous_namespace)::running_benchmark = 1;
                if (pIVar18->multithreaded == true) {
                  for (ptVar22 = local_4e8.
                                 super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                 _M_impl.super__Vector_impl_data._M_start; ptVar22 != ptVar7;
                      ptVar22 = ptVar22 + 1) {
                    if ((ptVar22->_M_id)._M_thread != 0) {
                      std::thread::join();
                    }
                  }
                  if (local_4e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_finish !=
                      local_4e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_start) {
                    uVar21 = 0;
                    do {
                      local_3d8._M_id._M_thread = (id)0;
                      local_4b0._0_8_ = operator_new(0x30);
                      (((mutex_type *)local_4b0._0_8_)->super___mutex_base)._M_mutex.__align =
                           (long)&PTR___State_00142830;
                      *(ThreadStats **)
                       ((long)&(((mutex_type *)local_4b0._0_8_)->super___mutex_base)._M_mutex + 8) =
                           &local_338;
                      (((mutex_type *)local_4b0._0_8_)->super___mutex_base)._M_mutex.__data.__kind =
                           (int)uVar21;
                      *(pointer *)
                       ((long)&(((mutex_type *)local_4b0._0_8_)->super___mutex_base)._M_mutex + 0x18
                       ) = iters;
                      (((mutex_type *)local_4b0._0_8_)->super___mutex_base)._M_mutex.__data.__list.
                      __next = (__pthread_internal_list *)pIVar18;
                      (((mutex_type *)(local_4b0._0_8_ + 0x28))->super___mutex_base)._M_mutex.
                      __align = (long)anon_unknown_1::RunInThread;
                      __p = (pointer)local_4b0;
                      std::thread::_M_start_thread(&local_3d8,__p,0);
                      if ((mutex_type *)local_4b0._0_8_ != (mutex_type *)0x0) {
                        (**(code **)(*(long *)local_4b0._0_8_ + 8))();
                      }
                      if (local_4e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar21]._M_id._M_thread != 0) {
                        std::terminate();
                      }
                      local_4e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar21]._M_id._M_thread =
                           (native_handle_type)local_3d8._M_id._M_thread;
                      uVar21 = uVar21 + 1;
                    } while (uVar21 < (ulong)((long)local_4e8.
                                                                                                        
                                                  super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)local_4e8.
                                                                                                        
                                                  super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3));
                  }
                }
                else {
                  __p = iters;
                  anon_unknown_1::RunInThread(pIVar18,(size_t)iters,0,&local_338);
                }
                Notification::WaitForNotification((Notification *)&local_2b8.__data);
                pmVar6 = (anonymous_namespace)::timer_manager;
                (anonymous_namespace)::running_benchmark = 0;
                local_4b0._0_8_ = (anonymous_namespace)::timer_manager;
                local_4b0._8_8_ = local_4b0._8_8_ & 0xffffffffffffff00;
                std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_4b0);
                local_4b0[8] = true;
                if (pmVar6[2].super___mutex_base._M_mutex.__size[0x18] != '\0') {
                  internal::CheckHandler::CheckHandler
                            (&local_2e0,"!running_",
                             "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
                             ,"cpu_time_used",0xf4);
                  internal::CheckHandler::~CheckHandler(&local_2e0);
                }
                internal::GetNullLogInstance();
                local_4c8 = *(__pthread_internal_list **)
                             ((long)&pmVar6[3].super___mutex_base._M_mutex + 0x10);
                std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_4b0);
                pmVar6 = (anonymous_namespace)::timer_manager;
                local_4b0._0_8_ = (anonymous_namespace)::timer_manager;
                local_4b0[8] = false;
                std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_4b0);
                local_4b0[8] = true;
                if (pmVar6[2].super___mutex_base._M_mutex.__size[0x18] != '\0') {
                  internal::CheckHandler::CheckHandler
                            (&local_2d8,"!running_",
                             "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
                             ,"real_time_used",0xed);
                  internal::CheckHandler::~CheckHandler(&local_2d8);
                }
                internal::GetNullLogInstance();
                p_Var28 = *(__pthread_internal_list **)
                           ((long)&pmVar6[3].super___mutex_base._M_mutex + 8);
                std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_4b0);
                pmVar6 = (anonymous_namespace)::timer_manager;
                local_4b0._0_8_ = (anonymous_namespace)::timer_manager;
                local_4b0[8] = false;
                std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_4b0);
                local_4b0[8] = 1;
                if (pmVar6[2].super___mutex_base._M_mutex.__size[0x18] != '\0') {
                  internal::CheckHandler::CheckHandler
                            (&local_2d0,"!running_",
                             "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
                             ,"manual_time_used",0xfb);
                  internal::CheckHandler::~CheckHandler(&local_2d0);
                }
                internal::GetNullLogInstance();
                local_3b8 = pmVar6[3].super___mutex_base._M_mutex.__data.__list.__prev;
                std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_4b0);
                std::
                __uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                ::reset((__uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                         *)0x0,__p);
                iVar14 = internal::GetLogLevel();
                if (iVar14 < 2) {
                  poVar15 = internal::GetNullLogInstance();
                }
                else {
                  poVar15 = internal::GetErrorLogInstance();
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,"-- LOG(",7);
                poVar15 = (ostream *)std::ostream::operator<<(poVar15,2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,"): ",3);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,"Ran in ",7);
                poVar15 = std::ostream::_M_insert<double>((double)local_4c8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,"/",1);
                poVar15 = std::ostream::_M_insert<double>((double)p_Var28);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
                local_2c8 = local_3b8;
                if ((pIVar18->use_manual_time == false) &&
                   (local_2c8 = local_4c8, pIVar18->use_real_time == true)) {
                  local_2c8 = p_Var28;
                }
                uStack_2c0 = 0;
                local_3d8._M_id._M_thread = (id)local_3c8;
                local_3d0 = 0;
                local_3c8[0] = 0;
                if (GetBenchmarkLock()::lock == '\0') {
                  RunSpecifiedBenchmarks();
                }
                local_4b0._0_8_ = GetBenchmarkLock()::lock;
                local_4b0._8_8_ = local_4b0._8_8_ & 0xffffffffffffff00;
                std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_4b0);
                local_4b0[8] = 1;
                (anonymous_namespace)::GetReportLabel_abi_cxx11_();
                std::__cxx11::string::_M_assign((string *)&local_3d8);
                std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_4b0);
                __s = (anonymous_namespace)::error_message;
                uVar21 = -(ulong)(ABS(pIVar18->min_time) < 2.220446049250313e-16);
                dVar4 = (double)(~uVar21 & (ulong)pIVar18->min_time |
                                (ulong)FLAGS_benchmark_min_time & uVar21);
                bVar25 = (anonymous_namespace)::error_message == (char *)0x0;
                bVar24 = iters < (pointer)0x3b9aca00;
                bVar12 = (double)local_2c8 < dVar4;
                bVar1 = (double)p_Var28 < dVar4 * 5.0;
                if (bVar1 && (bVar12 && ((bVar24 && local_4f4 == 0) && bVar25))) {
                  p_Var28 = (__pthread_internal_list *)0x3e112e0be826d695;
                  if (1e-09 <= (double)local_2c8) {
                    p_Var28 = local_2c8;
                  }
                  local_4b0._0_8_ = (dVar4 * 1.4) / (double)p_Var28;
                  puVar23 = (unique_lock<std::mutex> *)local_4b0;
                  if ((double)local_2c8 / dVar4 <= 0.1) {
                    local_308._0_8_ = (mutex_type *)0x4024000000000000;
                    puVar23 = (unique_lock<std::mutex> *)local_308;
                    if ((double)local_4b0._0_8_ < 10.0) {
                      puVar23 = (unique_lock<std::mutex> *)local_4b0;
                    }
                  }
                  local_4b0._0_8_ = puVar23->_M_device;
                  if ((double)local_4b0._0_8_ <= 1.0) {
                    local_4b0._0_8_ = (BenchmarkReporter *)0x4000000000000000;
                  }
                  uVar8 = local_4b0._0_8_;
                  auVar26._8_4_ = (int)((ulong)iters >> 0x20);
                  auVar26._0_8_ = iters;
                  auVar26._12_4_ = 0x45300000;
                  dStack_4c0 = auVar26._8_8_ - 1.9342813113834067e+25;
                  local_4c8 = (__pthread_internal_list *)
                              (dStack_4c0 +
                              ((double)CONCAT44(0x43300000,(int)iters) - 4503599627370496.0));
                  local_3b8 = (__pthread_internal_list *)((double)local_4c8 + 1.0);
                  dStack_3b0 = dStack_4c0;
                  iVar14 = internal::GetLogLevel();
                  if (iVar14 < 3) {
                    poVar15 = internal::GetNullLogInstance();
                  }
                  else {
                    poVar15 = internal::GetErrorLogInstance();
                  }
                  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"-- LOG(",7);
                  poVar15 = (ostream *)std::ostream::operator<<(poVar15,3);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"): ",3);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"Next iters: ",0xc);
                  local_4c8 = (__pthread_internal_list *)((double)local_4c8 * (double)uVar8);
                  p_Var28 = local_3b8;
                  if ((double)local_3b8 <= (double)local_4c8) {
                    p_Var28 = local_4c8;
                  }
                  local_4c8 = (__pthread_internal_list *)0x41cdcd6500000000;
                  if ((double)p_Var28 <= 1000000000.0) {
                    local_4c8 = p_Var28;
                  }
                  poVar15 = std::ostream::_M_insert<double>((double)local_4c8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar15,", ",2);
                  poVar15 = std::ostream::_M_insert<double>((double)uVar8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
                  iters = (pointer)(long)(int)((double)local_4c8 + 0.5);
                }
                else {
                  local_4b0._0_8_ = local_4a0;
                  local_4b0._8_8_ = 0;
                  local_4a0[0] = '\0';
                  local_4a0._16_8_ = &local_480;
                  local_488 = 0;
                  local_480._M_local_buf[0] = '\0';
                  local_470 = false;
                  local_468._M_p = (pointer)&local_458;
                  local_460 = (char *)0x0;
                  local_458._M_local_buf[0] = '\0';
                  local_448 = 1;
                  local_440 = kNanosecond;
                  local_400 = 0;
                  local_3fc._0_1_ = false;
                  local_3fc._1_1_ = false;
                  iStack_418 = 0;
                  uStack_414 = 0;
                  dStack_428 = 0.0;
                  uStack_420 = 0;
                  local_41c = 0;
                  local_438 = (__pthread_internal_list *)0x0;
                  p_Stack_430 = (__pthread_internal_list *)0x0;
                  std::__cxx11::string::_M_assign((string *)local_4b0);
                  pcVar9 = local_460;
                  local_470 = __s != (char *)0x0;
                  if (!local_470) {
                    __s = "";
                  }
                  strlen(__s);
                  pBVar20 = local_3a0;
                  std::__cxx11::string::_M_replace((ulong)&local_468,0,pcVar9,(ulong)__s);
                  std::__cxx11::string::_M_assign((string *)(local_4a0 + 0x10));
                  local_448 = (long)pIVar18->threads * (long)iters;
                  local_440 = pIVar18->time_unit;
                  if (local_470 == false) {
                    bVar3 = 0.0 < (double)local_2c8;
                    if (pIVar18->use_manual_time == false) {
                      local_3b8 = p_Var28;
                    }
                    local_438 = local_3b8;
                    p_Stack_430 = local_4c8;
                    auVar5._8_8_ = local_338.items_processed;
                    auVar5._0_8_ = local_338.bytes_processed;
                    auVar29 = auVar5 ^ _DAT_00135170;
                    auVar33._0_4_ = -(uint)((int)DAT_00135170 < auVar29._0_4_);
                    iVar14 = -(uint)(DAT_00135170._4_4_ < auVar29._4_4_);
                    auVar33._8_4_ = -(uint)(DAT_00135170._8_4_ < auVar29._8_4_);
                    iVar34 = -(uint)(DAT_00135170._12_4_ < auVar29._12_4_);
                    auVar30._4_4_ = -(uint)(auVar29._4_4_ == DAT_00135170._4_4_);
                    auVar30._12_4_ = -(uint)(auVar29._12_4_ == DAT_00135170._12_4_);
                    auVar30._0_4_ = auVar30._4_4_;
                    auVar30._8_4_ = auVar30._12_4_;
                    auVar31._1_3_ = 0;
                    auVar31[0] = bVar3;
                    auVar33._4_4_ = auVar33._0_4_;
                    auVar33._12_4_ = auVar33._8_4_;
                    auVar29._4_4_ = iVar14;
                    auVar29._0_4_ = iVar14;
                    auVar29._8_4_ = iVar34;
                    auVar29._12_4_ = iVar34;
                    auVar31[4] = bVar3;
                    auVar31._5_3_ = 0;
                    auVar31[8] = bVar3;
                    auVar31._9_3_ = 0;
                    auVar31[0xc] = bVar3;
                    auVar31._13_3_ = 0;
                    auVar31 = auVar31 & (auVar33 & auVar30 | auVar29);
                    auVar32._0_8_ =
                         CONCAT44((auVar31._4_4_ << 0x1f) >> 0x1f,(auVar31._0_4_ << 0x1f) >> 0x1f);
                    auVar32._8_4_ = (auVar31._8_4_ << 0x1f) >> 0x1f;
                    auVar32._12_4_ = (auVar31._12_4_ << 0x1f) >> 0x1f;
                    auVar29 = auVar5 & _DAT_00135180 | _DAT_00135190;
                    auVar27._0_8_ =
                         ((double)((ulong)local_338.bytes_processed >> 0x20 | 0x4530000000000000) -
                         1.9342813118337666e+25) + auVar29._0_8_;
                    auVar27._8_8_ =
                         ((double)((ulong)local_338.items_processed >> 0x20 | 0x4530000000000000) -
                         1.9342813118337666e+25) + auVar29._8_8_;
                    auVar2._8_8_ = local_2c8;
                    auVar2._0_8_ = local_2c8;
                    auVar29 = divpd(auVar27,auVar2);
                    dStack_428 = (double)(auVar29._0_8_ & auVar32._0_8_);
                    uVar21 = auVar29._8_8_ & auVar32._8_8_;
                    uStack_420 = (undefined4)uVar21;
                    local_41c = (undefined4)(uVar21 >> 0x20);
                    local_400 = local_338.complexity_n;
                    uStack_414._4_4_ = pIVar18->complexity;
                    local_408 = pIVar18->complexity_lambda;
                    if (pIVar18->complexity != oNone) {
                      std::
                      vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                      ::push_back(&local_378,(value_type *)local_4b0);
                    }
                  }
                  std::
                  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                  ::push_back(&local_398,(value_type *)local_4b0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_468._M_p != &local_458) {
                    operator_delete(local_468._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4a0._16_8_ != &local_480) {
                    operator_delete((void *)local_4a0._16_8_);
                  }
                  if ((BenchmarkReporter *)local_4b0._0_8_ != (BenchmarkReporter *)local_4a0) {
                    operator_delete((void *)local_4b0._0_8_);
                  }
                }
                if (local_3d8._M_id._M_thread != (id)local_3c8) {
                  operator_delete((void *)local_3d8._M_id._M_thread);
                }
                std::condition_variable::~condition_variable(local_290);
              } while (bVar1 && (bVar12 && ((bVar24 && local_4f4 == 0) && bVar25)));
              if ((undefined1 *)local_308._8_8_ != local_2f0) {
                operator_delete((void *)local_308._8_8_);
              }
              local_4f4 = local_4f4 + 1;
            } while (local_4f4 != local_4b4);
          }
          file_reporter = local_320;
          ptVar7 = local_4e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          ptVar22 = local_4e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (pIVar18->multithreaded != false) {
            for (; ptVar22 != ptVar7; ptVar22 = ptVar22 + 1) {
              std::thread::join();
            }
          }
          ComputeStats((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                        *)local_4b0,&local_398);
          if ((pIVar18->complexity != oNone) && (pIVar18->last_benchmark_instance == true)) {
            ComputeBigO((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                         *)&local_2b8.__data,&local_378);
            std::
            vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>
            ::
            _M_range_insert<__gnu_cxx::__normal_iterator<benchmark::BenchmarkReporter::Run*,std::vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>>>
                      ((vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>
                        *)local_4b0,local_4b0._8_8_,local_2b8.__align,local_2b8._8_8_);
            std::
            vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
            ::_M_erase_at_end(&local_378,
                              local_378.
                              super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            std::
            vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
            ::~vector((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                       *)&local_2b8.__data);
          }
          if (cVar13 != '\0') {
            std::
            vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
            ::_M_erase_at_end(&local_398,
                              local_398.
                              super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                              ._M_impl.super__Vector_impl_data._M_start);
          }
          std::
          vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>
          ::
          _M_range_insert<__gnu_cxx::__normal_iterator<benchmark::BenchmarkReporter::Run*,std::vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>>>
                    ((vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>
                      *)&local_398,
                     local_398.
                     super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                     ._M_impl.super__Vector_impl_data._M_finish,local_4b0._0_8_,local_4b0._8_8_);
          std::
          vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ::~vector((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                     *)local_4b0);
          std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_4e8);
          (**(code **)((((__mutex_base *)&local_3a8->_vptr_BenchmarkReporter)->_M_mutex).__align + 8
                      ))(local_3a8,
                         (vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>
                          *)&local_398);
          if (file_reporter != (BenchmarkReporter *)0x0) {
            (**(code **)((((__mutex_base *)&file_reporter->_vptr_BenchmarkReporter)->_M_mutex).
                         __align + 8))
                      (file_reporter,
                       (vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>
                        *)&local_398);
          }
          std::
          vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ::~vector(&local_398);
          pIVar18 = pIVar18 + 1;
          pBVar10 = local_3a0;
          pBVar11 = local_320;
        } while (pIVar18 != local_318);
      }
      (**(code **)((((__mutex_base *)&local_3a8->_vptr_BenchmarkReporter)->_M_mutex).__align + 0x10)
      )();
      if (file_reporter != (BenchmarkReporter *)0x0) {
        (**(code **)((((__mutex_base *)&file_reporter->_vptr_BenchmarkReporter)->_M_mutex).__align +
                    0x10))(file_reporter);
      }
      std::
      vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
      ::~vector(&local_378);
      if (pBVar20 != (BenchmarkReporter *)0x0) {
        (**(code **)((((__mutex_base *)&pBVar20->_vptr_BenchmarkReporter)->_M_mutex).__align + 0x20)
        )(pBVar20);
      }
      if (local_4f0 != (BenchmarkReporter *)0x0) {
        (**(code **)((((__mutex_base *)&local_4f0->_vptr_BenchmarkReporter)->_M_mutex).__align +
                    0x20))();
      }
      local_230 = _VTT;
      *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
      std::filebuf::~filebuf(local_228);
      std::ios_base::~ios_base(local_138);
    }
    sVar19 = ((long)local_3f8.
                    super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_3f8.
                    super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x1111111111111111;
  }
  else {
    sVar19 = 0;
  }
  std::
  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  ::~vector(&local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p);
  }
  return sVar19;
}

Assistant:

size_t RunSpecifiedBenchmarks(BenchmarkReporter* console_reporter,
                              BenchmarkReporter* file_reporter) {
  std::string spec = FLAGS_benchmark_filter;
  if (spec.empty() || spec == "all")
    spec = ".";  // Regexp that matches all benchmarks

  std::vector<internal::Benchmark::Instance> benchmarks;
  auto families = internal::BenchmarkFamilies::GetInstance();
  if (!families->FindBenchmarks(spec, &benchmarks)) return 0;

  if (FLAGS_benchmark_list_tests) {
    for (auto const& benchmark : benchmarks)
      std::cout <<  benchmark.name << "\n";
  } else {
    // Setup the reporters
    std::ofstream output_file;
    std::unique_ptr<BenchmarkReporter> default_console_reporter;
    std::unique_ptr<BenchmarkReporter> default_file_reporter;
    if (!console_reporter) {
      auto output_opts = FLAGS_color_print ? ConsoleReporter::OO_Color
                                           : ConsoleReporter::OO_None;
      default_console_reporter = internal::CreateReporter(
          FLAGS_benchmark_format, output_opts);
      console_reporter = default_console_reporter.get();
    }
    std::string const& fname = FLAGS_benchmark_out;
    if (fname == "" && file_reporter) {
      std::cerr << "A custom file reporter was provided but "
                   "--benchmark_out=<file> was not specified." << std::endl;
      std::exit(1);
    }
    if (fname != "") {
      output_file.open(fname);
      if (!output_file.is_open()) {
        std::cerr << "invalid file name: '" << fname << std::endl;
        std::exit(1);
      }
      if (!file_reporter) {
        default_file_reporter = internal::CreateReporter(
            FLAGS_benchmark_out_format, ConsoleReporter::OO_None);
        file_reporter = default_file_reporter.get();
      }
      file_reporter->SetOutputStream(&output_file);
      file_reporter->SetErrorStream(&output_file);
    }
    internal::RunMatchingBenchmarks(benchmarks, console_reporter, file_reporter);
  }
  return benchmarks.size();
}